

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

void ztast_destroy_statements(ztast_t *ast,ztast_statement_t *statements)

{
  ztast_statement *pzVar1;
  ztast_expr *pzVar2;
  ztast_value zVar3;
  int *piVar4;
  ztast_freefn_t *pzVar5;
  long lVar6;
  
  if (statements == (ztast_statement_t *)0x0) {
    return;
  }
LAB_00103403:
  if (statements->type == ZTSTMT_ASSIGNMENT) {
    pzVar2 = ((statements->u).assignment)->expr;
    switch(pzVar2->type) {
    case ZTEXPR_VALUE:
      goto switchD_00103445_caseD_0;
    case ZTEXPR_SCOPE:
      goto switchD_00103445_caseD_1;
    case ZTEXPR_INTARRAY:
      zVar3 = *(pzVar2->data).value;
      pzVar5 = ast->freefn;
      if (zVar3 != (ztast_value)0x0) {
        if (pzVar5 != (ztast_freefn_t *)0x0) {
          (*pzVar5)(*(void **)((long)zVar3 + 8),ast->opaque);
          if (ast->freefn != (ztast_freefn_t *)0x0) {
            (*ast->freefn)((void *)zVar3,ast->opaque);
            pzVar5 = ast->freefn;
            goto LAB_00103499;
          }
        }
        goto LAB_00103570;
      }
LAB_00103499:
      if (pzVar5 == (ztast_freefn_t *)0x0) goto switchD_00103445_default;
      goto LAB_00103523;
    case ZTEXPR_SCOPEARRAY:
      piVar4 = *(int **)pzVar2->data;
      if (piVar4 == (int *)0x0) goto switchD_00103445_caseD_0;
      if (0 < *piVar4) {
        lVar6 = 0;
        do {
          ztast_destroy_statements
                    (ast,(ztast_statement_t *)**(undefined8 **)(*(long *)(piVar4 + 2) + lVar6 * 8));
          if (ast->freefn != (ztast_freefn_t *)0x0) {
            (*ast->freefn)(*(void **)(*(long *)(piVar4 + 2) + lVar6 * 8),ast->opaque);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < *piVar4);
      }
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(*(void **)(piVar4 + 2),ast->opaque);
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)(piVar4,ast->opaque);
          goto switchD_00103445_caseD_0;
        }
      }
      goto LAB_00103570;
    default:
      goto switchD_00103445_default;
    }
  }
LAB_0010340a:
  pzVar1 = statements->next;
  if (ast->freefn != (ztast_freefn_t *)0x0) {
    (*ast->freefn)(statements,ast->opaque);
  }
LAB_00103573:
  statements = pzVar1;
  if (statements == (ztast_statement *)0x0) {
    return;
  }
  goto LAB_00103403;
switchD_00103445_caseD_1:
  ztast_destroy_statements(ast,(ztast_statement_t *)*(pzVar2->data).value);
switchD_00103445_caseD_0:
  pzVar5 = ast->freefn;
  if (pzVar5 != (ztast_freefn_t *)0x0) {
LAB_00103523:
    (*pzVar5)((pzVar2->data).value,ast->opaque);
switchD_00103445_default:
    if (ast->freefn != (ztast_freefn_t *)0x0) {
      (*ast->freefn)(pzVar2,ast->opaque);
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(((statements->u).assignment)->id,ast->opaque);
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)((statements->u).assignment,ast->opaque);
          goto LAB_0010340a;
        }
      }
    }
  }
LAB_00103570:
  pzVar1 = statements->next;
  goto LAB_00103573;
}

Assistant:

static void ztast_destroy_statements(ztast_t           *ast,
                                     ztast_statement_t *statements)
{
  ztast_statement_t *st;
  ztast_statement_t *next;

  if (statements == NULL)
    return; /* no statements */

  for (st = statements; st != NULL; st = next)
  {
    switch (st->type)
    {
    case ZTSTMT_ASSIGNMENT:
      ztast_destroy_expr(ast, st->u.assignment->expr);
      ZTAST_FREE(st->u.assignment->id);
      ZTAST_FREE(st->u.assignment);
      break;

    default:
      assert(0);
      break;
    }
    next = st->next;
    ZTAST_FREE(st);
  }
}